

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall HWISim::PinMode(HWISim *this,Pin pin,PinIOMode mode)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  PinIOMode local_18;
  Pin local_14;
  PinIOMode mode_local;
  Pin pin_local;
  HWISim *this_local;
  
  local_18 = mode;
  local_14 = pin;
  _mode_local = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"PM (");
  pmVar2 = std::
           unordered_map<HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EnumHash,_std::equal_to<HWI::Pin>,_std::allocator<std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&HWI::pinNames_abi_cxx11_,&local_14);
  poVar1 = std::operator<<(poVar1,(string *)pmVar2);
  poVar1 = std::operator<<(poVar1,") = ");
  pmVar3 = std::
           unordered_map<HWI::PinIOMode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EnumHash,_std::equal_to<HWI::PinIOMode>,_std::allocator<std::pair<const_HWI::PinIOMode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&HWI::pinIOModeNames_abi_cxx11_,&local_18);
  poVar1 = std::operator<<(poVar1,(string *)pmVar3);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void PinMode( Pin pin, PinIOMode mode ) override
  {
    std::cout << "PM (" << HWI::pinNames.at(pin) << ") = " << HWI::pinIOModeNames.at(mode) << "\n";
  }